

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O1

void up_heap(priority_queue *qp,size_t i)

{
  priority_queue_element *ppVar1;
  anon_union_8_2_94730108_for_payload aVar2;
  bool bVar3;
  wchar_t wVar4;
  undefined4 uVar5;
  wchar_t wVar6;
  undefined4 uVar7;
  ulong uVar8;
  priority_queue_element *ppVar9;
  priority_queue_element tmp;
  
  do {
    if (i == 0) {
      i = 0;
LAB_002143ee:
      uVar8 = i;
      bVar3 = false;
    }
    else {
      uVar8 = i - 1 >> 1;
      ppVar1 = qp->data;
      if (ppVar1[uVar8].priority <= ppVar1[i].priority) goto LAB_002143ee;
      ppVar9 = ppVar1 + uVar8;
      aVar2 = ppVar9->payload;
      wVar6 = ppVar9->priority;
      uVar7 = *(undefined4 *)&ppVar9->field_0xc;
      ppVar1 = ppVar1 + i;
      wVar4 = ppVar1->priority;
      uVar5 = *(undefined4 *)&ppVar1->field_0xc;
      ppVar9->payload = ppVar1->payload;
      ppVar9->priority = wVar4;
      *(undefined4 *)&ppVar9->field_0xc = uVar5;
      ppVar1 = qp->data + i;
      ppVar1->payload = aVar2;
      ppVar1->priority = wVar6;
      *(undefined4 *)&ppVar1->field_0xc = uVar7;
      bVar3 = true;
    }
    i = uVar8;
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

static void up_heap(struct priority_queue *qp, size_t i)
{
	while (1) {
		size_t parent;
		struct priority_queue_element tmp;

		if (i == 0) {
			break;
		}
		parent = (i - 1) >> 1;
		if (qp->data[i].priority >= qp->data[parent].priority) {
			break;
		}
		tmp = qp->data[parent];
		qp->data[parent] = qp->data[i];
		qp->data[i] = tmp;
		i = parent;
	}
}